

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::SPxMainSM(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,TYPE ttype)

{
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  double dVar2;
  cpp_dec_float<200U,_int,_void> *pcVar3;
  long in_FS_OFFSET;
  
  SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxSimplifier(&this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,"MainSM",ttype);
  (this->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  )._vptr_SPxSimplifier = (_func_int **)&PTR__SPxMainSM_006a6b98;
  (this->m_cBasisStat).data = (VarStatus *)0x0;
  (this->m_prim).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_prim).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_prim).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_slack).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_slack).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_slack).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_dual).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_dual).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_dual).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_redCost).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_redCost).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_redCost).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_cBasisStat).memFactor = 1.2;
  (this->m_cBasisStat).thesize = 0;
  (this->m_cBasisStat).themax = 1;
  spx_alloc<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::VarStatus*>
            (&(this->m_cBasisStat).data,1);
  (this->m_rBasisStat).data = (VarStatus *)0x0;
  (this->m_rBasisStat).memFactor = 1.2;
  (this->m_rBasisStat).thesize = 0;
  (this->m_rBasisStat).themax = 1;
  spx_alloc<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::VarStatus*>
            (&(this->m_rBasisStat).data,1);
  (this->m_cIdx).data = (int *)0x0;
  (this->m_cIdx).memFactor = 1.2;
  (this->m_cIdx).thesize = 0;
  (this->m_cIdx).themax = 1;
  spx_alloc<int*>(&(this->m_cIdx).data,1);
  (this->m_rIdx).data = (int *)0x0;
  (this->m_rIdx).memFactor = 1.2;
  (this->m_rIdx).thesize = 0;
  (this->m_rIdx).themax = 1;
  spx_alloc<int*>(&(this->m_rIdx).data,1);
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  ::Array(&this->m_hist,0);
  Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::Array(&this->m_classSetRows,0);
  Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::Array(&this->m_classSetCols,0);
  Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::Array(&this->m_dupRows,0);
  Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::Array(&this->m_dupCols,0);
  this->m_postsolved = false;
  (this->m_stat).data = (int *)0x0;
  (this->m_stat).memFactor = 1.2;
  (this->m_stat).thesize = 0x10;
  (this->m_stat).themax = 0x10;
  spx_alloc<int*>(&(this->m_stat).data,0x10);
  this->m_thesense = MAXIMIZE;
  this->m_keepbounds = false;
  this->m_addedcols = 0;
  this->m_result = OKAY;
  pnVar1 = &this->m_cutoffbound;
  ::soplex::infinity::__tls_init();
  dVar2 = *(double *)(in_FS_OFFSET + -8);
  (this->m_cutoffbound).m_backend.fpclass = cpp_dec_float_finite;
  pcVar3 = &(this->m_cutoffbound).m_backend;
  (pcVar3->data)._M_elems[0x18] = 0;
  (pcVar3->data)._M_elems[0x19] = 0;
  pcVar3 = &(this->m_cutoffbound).m_backend;
  (pcVar3->data)._M_elems[0x1a] = 0;
  (pcVar3->data)._M_elems[0x1b] = 0;
  pcVar3 = &(this->m_cutoffbound).m_backend;
  (pcVar3->data)._M_elems[0x14] = 0;
  (pcVar3->data)._M_elems[0x15] = 0;
  pcVar3 = &(this->m_cutoffbound).m_backend;
  (pcVar3->data)._M_elems[0x16] = 0;
  (pcVar3->data)._M_elems[0x17] = 0;
  pcVar3 = &(this->m_cutoffbound).m_backend;
  (pcVar3->data)._M_elems[0x10] = 0;
  (pcVar3->data)._M_elems[0x11] = 0;
  pcVar3 = &(this->m_cutoffbound).m_backend;
  (pcVar3->data)._M_elems[0x12] = 0;
  (pcVar3->data)._M_elems[0x13] = 0;
  pcVar3 = &(this->m_cutoffbound).m_backend;
  (pcVar3->data)._M_elems[0xc] = 0;
  (pcVar3->data)._M_elems[0xd] = 0;
  pcVar3 = &(this->m_cutoffbound).m_backend;
  (pcVar3->data)._M_elems[0xe] = 0;
  (pcVar3->data)._M_elems[0xf] = 0;
  pcVar3 = &(this->m_cutoffbound).m_backend;
  (pcVar3->data)._M_elems[8] = 0;
  (pcVar3->data)._M_elems[9] = 0;
  pcVar3 = &(this->m_cutoffbound).m_backend;
  (pcVar3->data)._M_elems[10] = 0;
  (pcVar3->data)._M_elems[0xb] = 0;
  pcVar3 = &(this->m_cutoffbound).m_backend;
  (pcVar3->data)._M_elems[4] = 0;
  (pcVar3->data)._M_elems[5] = 0;
  pcVar3 = &(this->m_cutoffbound).m_backend;
  (pcVar3->data)._M_elems[6] = 0;
  (pcVar3->data)._M_elems[7] = 0;
  (pnVar1->m_backend).data._M_elems[0] = 0;
  (pnVar1->m_backend).data._M_elems[1] = 0;
  pcVar3 = &(this->m_cutoffbound).m_backend;
  (pcVar3->data)._M_elems[2] = 0;
  (pcVar3->data)._M_elems[3] = 0;
  *(undefined8 *)((long)(this->m_cutoffbound).m_backend.data._M_elems + 0x6d) = 0;
  (this->m_cutoffbound).m_backend.prec_elem = 0x1c;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)pnVar1,-dVar2);
  pnVar1 = &this->m_pseudoobj;
  ::soplex::infinity::__tls_init();
  (this->m_pseudoobj).m_backend.fpclass = cpp_dec_float_finite;
  pcVar3 = &(this->m_pseudoobj).m_backend;
  (pcVar3->data)._M_elems[0x18] = 0;
  (pcVar3->data)._M_elems[0x19] = 0;
  pcVar3 = &(this->m_pseudoobj).m_backend;
  (pcVar3->data)._M_elems[0x1a] = 0;
  (pcVar3->data)._M_elems[0x1b] = 0;
  pcVar3 = &(this->m_pseudoobj).m_backend;
  (pcVar3->data)._M_elems[0x14] = 0;
  (pcVar3->data)._M_elems[0x15] = 0;
  pcVar3 = &(this->m_pseudoobj).m_backend;
  (pcVar3->data)._M_elems[0x16] = 0;
  (pcVar3->data)._M_elems[0x17] = 0;
  pcVar3 = &(this->m_pseudoobj).m_backend;
  (pcVar3->data)._M_elems[0x10] = 0;
  (pcVar3->data)._M_elems[0x11] = 0;
  pcVar3 = &(this->m_pseudoobj).m_backend;
  (pcVar3->data)._M_elems[0x12] = 0;
  (pcVar3->data)._M_elems[0x13] = 0;
  pcVar3 = &(this->m_pseudoobj).m_backend;
  (pcVar3->data)._M_elems[0xc] = 0;
  (pcVar3->data)._M_elems[0xd] = 0;
  pcVar3 = &(this->m_pseudoobj).m_backend;
  (pcVar3->data)._M_elems[0xe] = 0;
  (pcVar3->data)._M_elems[0xf] = 0;
  pcVar3 = &(this->m_pseudoobj).m_backend;
  (pcVar3->data)._M_elems[8] = 0;
  (pcVar3->data)._M_elems[9] = 0;
  pcVar3 = &(this->m_pseudoobj).m_backend;
  (pcVar3->data)._M_elems[10] = 0;
  (pcVar3->data)._M_elems[0xb] = 0;
  pcVar3 = &(this->m_pseudoobj).m_backend;
  (pcVar3->data)._M_elems[4] = 0;
  (pcVar3->data)._M_elems[5] = 0;
  pcVar3 = &(this->m_pseudoobj).m_backend;
  (pcVar3->data)._M_elems[6] = 0;
  (pcVar3->data)._M_elems[7] = 0;
  (pnVar1->m_backend).data._M_elems[0] = 0;
  (pnVar1->m_backend).data._M_elems[1] = 0;
  pcVar3 = &(this->m_pseudoobj).m_backend;
  (pcVar3->data)._M_elems[2] = 0;
  (pcVar3->data)._M_elems[3] = 0;
  *(undefined8 *)((long)(this->m_pseudoobj).m_backend.data._M_elems + 0x6d) = 0;
  (this->m_pseudoobj).m_backend.prec_elem = 0x1c;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)pnVar1,-dVar2);
  return;
}

Assistant:

SPxMainSM(Timer::TYPE ttype = Timer::USER_TIME)
      : SPxSimplifier<R>("MainSM", ttype)
      , m_postsolved(0)
      , m_stat(16)
      , m_thesense(SPxLPBase<R>::MAXIMIZE)
      , m_keepbounds(false)
      , m_addedcols(0)
      , m_result(this->OKAY)
      , m_cutoffbound(R(-infinity))
      , m_pseudoobj(R(-infinity))
   {}